

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_deflate_concurrency.cc
# Opt level: O0

void __thiscall Mutator::run(Mutator *this)

{
  State SVar1;
  atomic<Mutator::State> *in_RDI;
  uint8_t *i;
  uint8_t *__end2;
  uint8_t *__begin2;
  uint8_t (*__range2) [8192];
  uint8_t *local_18;
  
  while( true ) {
    do {
      SVar1 = std::atomic::operator_cast_to_State((atomic<Mutator::State> *)0x154191);
      std::atomic<Mutator::State>::store(in_RDI,SVar1,memory_order_seq_cst);
      SVar1 = std::atomic::operator_cast_to_State((atomic<Mutator::State> *)0x1541ac);
    } while (SVar1 == PAUSED);
    SVar1 = std::atomic::operator_cast_to_State((atomic<Mutator::State> *)0x1541bd);
    if (SVar1 == STOPPED) break;
    for (local_18 = ::buf; local_18 != zbuf; local_18 = local_18 + 1) {
      *local_18 = *local_18 + '\x01';
    }
  }
  return;
}

Assistant:

void run() {
        while (true) {
            m_state.store(m_target_state);
            if (m_state == State::PAUSED)
                continue;
            if (m_state == State::STOPPED)
                break;
            for (uint8_t & i: buf)
                i++;
        }
    }